

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

int m256v_row_iszero(m256v *M,int r)

{
  uint8_t uVar1;
  int in_ESI;
  m256v *in_RDI;
  int c;
  int c_00;
  
  c_00 = 0;
  while( true ) {
    if (in_RDI->n_col <= c_00) {
      return 1;
    }
    uVar1 = m256v_get_el(in_RDI,in_ESI,c_00);
    if (uVar1 != '\0') break;
    c_00 = c_00 + 1;
  }
  return 0;
}

Assistant:

int m256v_row_iszero(const m256v* M, int r)
{
	for (int c = 0; c < M->n_col; ++c) {
		if (get_el(M, r, c) != 0) {
			return 0;
		}
	}
	return 1;
}